

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NwnDefines.h
# Opt level: O0

void CNwnByteOrderCore<unsigned_int>::BigEndianSwap(uchar *in,uchar *out)

{
  uchar uVar1;
  uchar cb;
  uchar ca;
  uchar *out_local;
  uchar *in_local;
  
  uVar1 = in[3];
  out[3] = *in;
  *out = uVar1;
  uVar1 = in[2];
  out[2] = in[1];
  out[1] = uVar1;
  return;
}

Assistant:

static void BigEndianSwap (const unsigned char *in, unsigned char *out)
	{
		unsigned char ca = in [0];
		unsigned char cb = in [3];
		out [3] = ca;
		out [0] = cb;
		ca = in [1];
		cb = in [2];
		out [2] = ca;
		out [1] = cb;
	}